

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O2

size_t byte_encode(uint8_t *obuff,size_t osize,uint64_t v,uint64_t max)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = v - 1;
  sVar1 = 0;
  for (uVar2 = max - 1; uVar2 != 0; uVar2 = uVar2 >> 8) {
    obuff[sVar1] = (uint8_t)uVar3;
    sVar1 = sVar1 + 1;
    uVar3 = uVar3 >> 8;
  }
  return sVar1;
}

Assistant:

size_t byte_encode(uint8_t* obuff, size_t osize, uint64_t v, uint64_t max)
{
    int op = 0;
    max--; /* working here with zero-origin values */
    v--;
    while (max) {
        // myassert(op < osize);
        obuff[op++] = v & 255;
        v >>= 8;
        max >>= 8;
    }
    return op;
}